

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::ConcurrentTransferSweptObjects
          (Recycler *this,RecyclerSweepManager *recyclerSweepManager)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = RecyclerSweepManager::IsBackground(recyclerSweepManager);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1645,"(!recyclerSweepManager.IsBackground())",
                       "!recyclerSweepManager.IsBackground()");
    if (!bVar2) goto LAB_00714c21;
    *puVar3 = 0;
  }
  if (((this->collectionState).value & Collection_TransferSwept) == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1646,
                       "((this->collectionState & Collection_TransferSwept) == Collection_TransferSwept)"
                       ,
                       "(this->collectionState & Collection_TransferSwept) == Collection_TransferSwept"
                      );
    if (!bVar2) {
LAB_00714c21:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->hasBackgroundFinishPartial == true) {
    this->hasBackgroundFinishPartial = false;
    ClearPartialCollect(this);
  }
  HeapInfoManager::ConcurrentTransferSweptObjects(&this->autoHeap,recyclerSweepManager);
  return;
}

Assistant:

void
Recycler::ConcurrentTransferSweptObjects(RecyclerSweepManager& recyclerSweepManager)
{
    Assert(!recyclerSweepManager.IsBackground());
    Assert((this->collectionState & Collection_TransferSwept) == Collection_TransferSwept);
#if ENABLE_PARTIAL_GC
    if (this->hasBackgroundFinishPartial)
    {
        this->hasBackgroundFinishPartial = false;
        this->ClearPartialCollect();
    }
#endif
    autoHeap.ConcurrentTransferSweptObjects(recyclerSweepManager);
}